

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<const_kj::ReadableDirectory_*>::setCapacity
          (Vector<const_kj::ReadableDirectory_*> *this,size_t newSize)

{
  ReadableDirectory **ppRVar1;
  ReadableDirectory **ppRVar2;
  RemoveConst<const_kj::ReadableDirectory_*> *ppRVar3;
  ReadableDirectory **__dest;
  ulong __n;
  ArrayBuilder<const_kj::ReadableDirectory_*> newBuilder;
  ArrayBuilder<const_kj::ReadableDirectory_*> local_38;
  
  ppRVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppRVar1 >> 3)) {
    (this->builder).pos = ppRVar1 + newSize;
  }
  __dest = (ReadableDirectory **)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  ppRVar1 = (this->builder).ptr;
  ppRVar2 = (this->builder).pos;
  local_38.ptr = __dest;
  if (ppRVar1 != ppRVar2) {
    __n = (long)ppRVar2 - (long)ppRVar1 & 0xfffffffffffffff8;
    local_38.pos = __dest;
    memcpy(__dest,ppRVar1,__n);
    __dest = (ReadableDirectory **)((long)__dest + __n);
  }
  local_38.pos = __dest;
  ArrayBuilder<const_kj::ReadableDirectory_*>::operator=(&this->builder,&local_38);
  ppRVar2 = local_38.endPtr;
  ppRVar3 = local_38.pos;
  ppRVar1 = local_38.ptr;
  if (local_38.ptr != (ReadableDirectory **)0x0) {
    local_38.ptr = (ReadableDirectory **)0x0;
    local_38.pos = (RemoveConst<const_kj::ReadableDirectory_*> *)0x0;
    local_38.endPtr = (ReadableDirectory **)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,ppRVar1,8,(long)ppRVar3 - (long)ppRVar1 >> 3,
               (long)ppRVar2 - (long)ppRVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }